

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

int linsolve_wiener(int n,int64_t *A,int stride,int64_t *b,int64_t *x)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int64_t *piVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar12;
  sbyte sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int64_t *piVar17;
  long lVar18;
  long lVar19;
  int j;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  sbyte sVar23;
  ulong uVar24;
  int j_2;
  bool bVar25;
  undefined1 auVar26 [16];
  int local_a4;
  int64_t *local_80;
  int64_t *piVar11;
  
  uVar5 = n - 1;
  lVar10 = (long)(int)uVar5;
  uVar24 = (ulong)uVar5;
  bVar8 = 1 < n;
  if (1 < n) {
    uVar4 = (ulong)(uint)n;
    lVar18 = uVar4 - 1;
    lVar19 = (long)stride;
    local_80 = A + lVar19;
    uVar16 = 0;
    local_a4 = 0;
    piVar6 = A + lVar18 * lVar19;
    piVar11 = A + (uVar4 - 2) * lVar19;
    lVar15 = lVar18;
    piVar17 = A;
    do {
      do {
        lVar14 = lVar15 + -1;
        uVar20 = A[uVar16 + lVar14 * lVar19];
        uVar12 = -uVar20;
        if (0 < (long)uVar20) {
          uVar12 = uVar20;
        }
        uVar20 = A[uVar16 + lVar15 * lVar19];
        uVar22 = -uVar20;
        if (0 < (long)uVar20) {
          uVar22 = uVar20;
        }
        if (uVar12 < uVar22) {
          uVar20 = 0;
          do {
            iVar2 = piVar6[uVar20];
            piVar6[uVar20] = piVar11[uVar20];
            piVar11[uVar20] = iVar2;
            uVar20 = uVar20 + 1;
          } while (uVar4 != uVar20);
          auVar1 = *(undefined1 (*) [16])(b + lVar14);
          auVar26._0_8_ = auVar1._8_8_;
          auVar26._8_4_ = auVar1._0_4_;
          auVar26._12_4_ = auVar1._4_4_;
          *(undefined1 (*) [16])(b + lVar14) = auVar26;
        }
        piVar6 = piVar6 + -lVar19;
        piVar11 = piVar11 + -lVar19;
        lVar15 = lVar14;
      } while ((long)uVar16 < lVar14);
      uVar12 = 0;
      uVar20 = 0;
      do {
        uVar22 = piVar17[uVar12];
        uVar7 = -uVar22;
        if (0 < (long)uVar22) {
          uVar7 = uVar22;
        }
        if ((long)uVar7 <= (long)uVar20) {
          uVar7 = uVar20;
        }
        uVar12 = uVar12 + 1;
        uVar20 = uVar7;
      } while (uVar4 != uVar12);
      bVar25 = uVar7 < 0x400000;
      lVar15 = 0x80;
      if (bVar25) {
        lVar15 = 1;
      }
      uVar9 = (int)uVar16 + local_a4 * stride;
      lVar14 = 0x40;
      if (bVar25) {
        lVar14 = 1;
      }
      sVar23 = 0xd;
      if (bVar25) {
        sVar23 = 0;
      }
      sVar13 = 7;
      if (bVar25) {
        sVar13 = 0;
      }
      lVar21 = A[uVar9];
      piVar6 = local_80;
      uVar20 = uVar16;
      if (lVar21 == 0) {
LAB_002047f1:
        if (bVar8) {
          return 0;
        }
        break;
      }
      do {
        uVar20 = uVar20 + 1;
        lVar3 = A[uVar16 + uVar20 * lVar19];
        uVar12 = 0;
        do {
          piVar6[uVar12] =
               piVar6[uVar12] - (((piVar17[uVar12] / lVar14) * (lVar3 / lVar15)) / lVar21 << sVar23)
          ;
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
        b[uVar20] = b[uVar20] - ((b[uVar16] * (lVar3 / lVar15)) / lVar21 << sVar13);
        if (uVar20 == uVar24) goto LAB_002047b6;
        lVar21 = A[uVar9];
        piVar6 = piVar6 + lVar19;
      } while (lVar21 != 0);
      if ((long)uVar20 < lVar10) goto LAB_002047f1;
LAB_002047b6:
      uVar16 = uVar16 + 1;
      local_a4 = local_a4 + 1;
      bVar8 = (long)uVar16 < lVar10;
      piVar17 = piVar17 + lVar19;
      local_80 = local_80 + lVar19;
      piVar6 = A + lVar18 * lVar19;
      piVar11 = A + (uVar4 - 2) * lVar19;
      lVar15 = lVar18;
    } while (uVar16 != uVar24);
  }
  uVar9 = uVar5;
  if (0 < n) {
    lVar18 = (long)A + ((ulong)(uint)stride * 8 + 8) * uVar24 + 8;
    piVar6 = x + uVar24 + 1;
    do {
      uVar9 = (uint)uVar24;
      if (A[uVar24 + uVar9 * stride] == 0) goto LAB_002048d3;
      if ((long)uVar24 < lVar10) {
        lVar19 = 0;
        lVar15 = 0;
        do {
          lVar21 = piVar6[lVar19] * *(long *)(lVar18 + lVar19 * 8);
          lVar14 = lVar21 + 0xffff;
          if (-1 < lVar21) {
            lVar14 = lVar21;
          }
          lVar15 = lVar15 + (lVar14 >> 0x10);
          lVar19 = lVar19 + 1;
        } while ((int)(uVar9 + (int)lVar19) < (int)uVar5);
      }
      else {
        lVar15 = 0;
      }
      x[uVar24] = ((b[uVar24] - lVar15) * 0x10000) / A[uVar24 + uVar9 * stride];
      lVar18 = lVar18 + ((ulong)(uint)stride << 3 ^ 0xfffffffffffffff8);
      piVar6 = piVar6 + -1;
      bVar8 = 0 < (long)uVar24;
      uVar24 = uVar24 - 1;
    } while (bVar8);
    uVar9 = 0xffffffff;
  }
LAB_002048d3:
  return uVar9 >> 0x1f;
}

Assistant:

static int linsolve_wiener(int n, int64_t *A, int stride, int64_t *b,
                           int64_t *x) {
  for (int k = 0; k < n - 1; k++) {
    // Partial pivoting: bring the row with the largest pivot to the top
    for (int i = n - 1; i > k; i--) {
      // If row i has a better (bigger) pivot than row (i-1), swap them
      if (llabs(A[(i - 1) * stride + k]) < llabs(A[i * stride + k])) {
        for (int j = 0; j < n; j++) {
          const int64_t c = A[i * stride + j];
          A[i * stride + j] = A[(i - 1) * stride + j];
          A[(i - 1) * stride + j] = c;
        }
        const int64_t c = b[i];
        b[i] = b[i - 1];
        b[i - 1] = c;
      }
    }

    // b/278065963: The multiplies
    //   c / 256 * A[k * stride + j] / cd * 256
    // and
    //   c / 256 * b[k] / cd * 256
    // within Gaussian elimination can cause a signed integer overflow. Rework
    // the multiplies so that larger scaling is used without significantly
    // impacting the overall precision.
    //
    // Precision guidance:
    //   scale_threshold: Pick as high as possible.
    // For max_abs_akj >= scale_threshold scenario:
    //   scaler_A: Pick as low as possible. Needed for A[(i + 1) * stride + j].
    //   scaler_c: Pick as low as possible while maintaining scaler_c >=
    //     (1 << 7). Needed for A[(i + 1) * stride + j] and b[i + 1].
    int64_t max_abs_akj = 0;
    for (int j = 0; j < n; j++) {
      const int64_t abs_akj = llabs(A[k * stride + j]);
      if (abs_akj > max_abs_akj) max_abs_akj = abs_akj;
    }
    const int scale_threshold = 1 << 22;
    const int scaler_A = max_abs_akj < scale_threshold ? 1 : (1 << 6);
    const int scaler_c = max_abs_akj < scale_threshold ? 1 : (1 << 7);
    const int scaler = scaler_c * scaler_A;

    // Forward elimination (convert A to row-echelon form)
    for (int i = k; i < n - 1; i++) {
      if (A[k * stride + k] == 0) return 0;
      const int64_t c = A[(i + 1) * stride + k] / scaler_c;
      const int64_t cd = A[k * stride + k];
      for (int j = 0; j < n; j++) {
        A[(i + 1) * stride + j] -=
            A[k * stride + j] / scaler_A * c / cd * scaler;
      }
      b[i + 1] -= c * b[k] / cd * scaler_c;
    }
  }
  // Back-substitution
  for (int i = n - 1; i >= 0; i--) {
    if (A[i * stride + i] == 0) return 0;
    int64_t c = 0;
    for (int j = i + 1; j <= n - 1; j++) {
      c += A[i * stride + j] * x[j] / WIENER_TAP_SCALE_FACTOR;
    }
    // Store filter taps x in scaled form.
    x[i] = WIENER_TAP_SCALE_FACTOR * (b[i] - c) / A[i * stride + i];
  }

  return 1;
}